

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O2

void re2::Parse_CachedDigits_PCRE(int i)

{
  Parse3Digits(i,Parse3CachedPCRE);
  return;
}

Assistant:

void Parse_CachedDigits_PCRE(int i)        { Parse3Digits(i, Parse3CachedPCRE); }